

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

void winPath(string *path)

{
  int iVar1;
  char *pcVar2;
  undefined1 *puVar3;
  undefined4 local_14;
  int size;
  int i;
  string *path_local;
  
  local_14 = 0;
  iVar1 = std::__cxx11::string::size();
  for (; local_14 < iVar1; local_14 = local_14 + 1) {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)path);
    if (*pcVar2 == '/') {
      puVar3 = (undefined1 *)std::__cxx11::string::operator[]((ulong)path);
      *puVar3 = 0x5c;
    }
  }
  return;
}

Assistant:

void winPath( string& path )
{
	for (int i = 0, size = path.size(); i < size; i++)
	{
		if (path[i] == '/')
			path[i] = '\\';
	}
}